

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

void __thiscall Portal::setup(Portal *this,Spritesheet *spritesheet,int height)

{
  Animation *this_00;
  pointer *ppSVar1;
  pointer pSVar2;
  Sprite *pSVar3;
  float fVar4;
  iterator iVar5;
  float fVar6;
  
  this_00 = &this->animation;
  pSVar2 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  pSVar3 = (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (this->flipVertically == true) {
    if (iVar5._M_current == pSVar3) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x29);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x29].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x29].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x29].sx;
      fVar4 = pSVar2[0x29].sy;
      (iVar5._M_current)->img = pSVar2[0x29].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x2a);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x2a].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x2a].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x2a].sx;
      fVar4 = pSVar2[0x2a].sy;
      (iVar5._M_current)->img = pSVar2[0x2a].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x2b);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x2b].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x2b].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x2b].sx;
      fVar4 = pSVar2[0x2b].sy;
      (iVar5._M_current)->img = pSVar2[0x2b].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x2c);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x2c].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x2c].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x2c].sx;
      fVar4 = pSVar2[0x2c].sy;
      (iVar5._M_current)->img = pSVar2[0x2c].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x2d);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x2d].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x2d].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x2d].sx;
      fVar4 = pSVar2[0x2d].sy;
      (iVar5._M_current)->img = pSVar2[0x2d].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x2e);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x2e].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x2e].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x2e].sx;
      fVar4 = pSVar2[0x2e].sy;
      (iVar5._M_current)->img = pSVar2[0x2e].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x2f);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x2f].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x2f].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x2f].sx;
      fVar4 = pSVar2[0x2f].sy;
      (iVar5._M_current)->img = pSVar2[0x2f].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x30);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x30].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x30].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x30].sx;
      fVar4 = pSVar2[0x30].sy;
      (iVar5._M_current)->img = pSVar2[0x30].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x31);
    }
    else {
      fVar6 = pSVar2[0x31].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x31].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x31].sx;
      fVar4 = pSVar2[0x31].sy;
      (iVar5._M_current)->img = pSVar2[0x31].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      ppSVar1 = &(this->animation).frames.
                 super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    fVar6 = 32.0;
  }
  else {
    if (iVar5._M_current == pSVar3) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x32);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x32].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x32].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x32].sx;
      fVar4 = pSVar2[0x32].sy;
      (iVar5._M_current)->img = pSVar2[0x32].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x33);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x33].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x33].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x33].sx;
      fVar4 = pSVar2[0x33].sy;
      (iVar5._M_current)->img = pSVar2[0x33].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x34);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x34].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x34].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x34].sx;
      fVar4 = pSVar2[0x34].sy;
      (iVar5._M_current)->img = pSVar2[0x34].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x35);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x35].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x35].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x35].sx;
      fVar4 = pSVar2[0x35].sy;
      (iVar5._M_current)->img = pSVar2[0x35].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x36);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x36].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x36].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x36].sx;
      fVar4 = pSVar2[0x36].sy;
      (iVar5._M_current)->img = pSVar2[0x36].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x37);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x37].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x37].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x37].sx;
      fVar4 = pSVar2[0x37].sy;
      (iVar5._M_current)->img = pSVar2[0x37].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x38);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x38].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x38].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x38].sx;
      fVar4 = pSVar2[0x38].sy;
      (iVar5._M_current)->img = pSVar2[0x38].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x39);
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      fVar6 = pSVar2[0x39].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x39].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x39].sx;
      fVar4 = pSVar2[0x39].sy;
      (iVar5._M_current)->img = pSVar2[0x39].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      iVar5._M_current =
           (this->animation).frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    pSVar2 = (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5._M_current ==
        (this->animation).frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
      _M_realloc_insert<piksel::Sprite_const&>
                ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this_00,iVar5,
                 pSVar2 + 0x3a);
    }
    else {
      fVar6 = pSVar2[0x3a].sHeight;
      (iVar5._M_current)->sWidth = pSVar2[0x3a].sWidth;
      (iVar5._M_current)->sHeight = fVar6;
      fVar6 = pSVar2[0x3a].sx;
      fVar4 = pSVar2[0x3a].sy;
      (iVar5._M_current)->img = pSVar2[0x3a].img;
      (iVar5._M_current)->sx = fVar6;
      (iVar5._M_current)->sy = fVar4;
      ppSVar1 = &(this->animation).frames.
                 super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    fVar6 = (float)height + -32.0;
  }
  (this->super_AABB).center.field_0.field_0.y = fVar6;
  (this->animation).millisPerFrame = 0x32;
  return;
}

Assistant:

void Portal::setup(piksel::Spritesheet& spritesheet, int height) {
    if (flipVertically) {
        animation.frames.push_back(spritesheet.sprites[41]);
        animation.frames.push_back(spritesheet.sprites[42]);
        animation.frames.push_back(spritesheet.sprites[43]);
        animation.frames.push_back(spritesheet.sprites[44]);
        animation.frames.push_back(spritesheet.sprites[45]);
        animation.frames.push_back(spritesheet.sprites[46]);
        animation.frames.push_back(spritesheet.sprites[47]);
        animation.frames.push_back(spritesheet.sprites[48]);
        animation.frames.push_back(spritesheet.sprites[49]);

        center.y = 32.0f;
    } else {
        animation.frames.push_back(spritesheet.sprites[50]);
        animation.frames.push_back(spritesheet.sprites[51]);
        animation.frames.push_back(spritesheet.sprites[52]);
        animation.frames.push_back(spritesheet.sprites[53]);
        animation.frames.push_back(spritesheet.sprites[54]);
        animation.frames.push_back(spritesheet.sprites[55]);
        animation.frames.push_back(spritesheet.sprites[56]);
        animation.frames.push_back(spritesheet.sprites[57]);
        animation.frames.push_back(spritesheet.sprites[58]);

        center.y = height - PORTAL_HEIGHT / 2.0f;
    }

    animation.millisPerFrame = 50;
}